

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall Assimp::OpenGEX::OpenGEXImporter::~OpenGEXImporter(OpenGEXImporter *this)

{
  ~OpenGEXImporter(this);
  operator_delete(this);
  return;
}

Assistant:

OpenGEXImporter::~OpenGEXImporter() {
    m_ctx = nullptr;
}